

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

int __thiscall
GEO::geofile::import_mesh_spacing
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector)

{
  bool bVar1;
  reference pvVar2;
  double dVar3;
  undefined1 local_40 [8];
  string msh_spc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *split_string_vector_local;
  geofile *this_local;
  
  msh_spc.field_2._8_8_ = split_string_vector;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](split_string_vector,1);
  boost::algorithm::erase_all<std::__cxx11::string,char[2]>(pvVar2,(char (*) [2])0x1f404d);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)msh_spc.field_2._8_8_,1);
  bVar1 = is_e_notation(pvVar2);
  if (bVar1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)msh_spc.field_2._8_8_,1);
    std::__cxx11::string::string((string *)local_40,(string *)pvVar2);
    dVar3 = std::__cxx11::stod((string *)local_40,(size_t *)0x0);
    this->mesh_spacing = dVar3;
    std::__cxx11::string::~string((string *)local_40);
  }
  this_local._4_4_ = (uint)!bVar1;
  return this_local._4_4_;
}

Assistant:

int GEO::geofile::import_mesh_spacing(std::vector<std::string> &split_string_vector)
{
    boost::erase_all(split_string_vector[1], ";");
    if (is_e_notation(split_string_vector[1]))
    {
        std::string msh_spc = split_string_vector[1];
        mesh_spacing = std::stod(msh_spc);
        return EXIT_SUCCESS;
    }
    else
        return EXIT_FAILURE;
}